

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopn_file.c
# Opt level: O1

WOPNFile * WOPN_LoadBankFromMem(void *mem,size_t length,int *error)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  WOPNBank *pWVar4;
  ushort percussive_banks;
  ulong uVar5;
  long lVar6;
  ushort melodic_banks;
  ulong uVar7;
  ushort *cursor;
  ushort uVar8;
  undefined8 unaff_R15;
  ulong uVar9;
  bool bVar10;
  uint16_t bankslots_sizes [2];
  WOPNBank *bankslots [2];
  WOPNFile *local_80;
  ushort local_74 [2];
  ulong local_70;
  int *local_68;
  ulong local_60;
  WOPNBank *local_58 [3];
  long local_40;
  ulong local_38;
  
  if (mem == (void *)0x0) {
    iVar2 = 6;
    goto LAB_00164b8e;
  }
  if (length < 0xb) {
LAB_00164b33:
    iVar2 = 2;
    goto LAB_00164b8e;
  }
  bVar10 = *(long *)((long)mem + 3) == 0x4b4e41422d324e;
  if (bVar10 && *mem == 0x41422d324e504f57) {
    uVar7 = CONCAT62((int6)((ulong)unaff_R15 >> 0x10),1);
  }
  else {
    if (*(long *)((long)mem + 3) != 0x4b4e32422d324e || *mem != 0x32422d324e504f57) {
      iVar2 = 1;
      goto LAB_00164b8e;
    }
    uVar7 = 0;
  }
  uVar5 = length - 0xb;
  if (bVar10 && *mem == 0x41422d324e504f57) {
    cursor = (ushort *)((long)mem + 0xb);
  }
  else {
    if (uVar5 < 2) goto LAB_00164b33;
    uVar7 = (ulong)*(ushort *)((long)mem + 0xb);
    if (2 < *(ushort *)((long)mem + 0xb)) {
      iVar2 = 4;
      goto LAB_00164b8e;
    }
    cursor = (ushort *)((long)mem + 0xd);
    uVar5 = length - 0xd;
  }
  local_68 = error;
  uVar8 = (ushort)uVar7;
  if (uVar5 < 5) {
    melodic_banks = 1;
    if (error != (int *)0x0) {
      *error = 2;
    }
    percussive_banks = 1;
LAB_00164c8e:
    local_80 = (WOPNFile *)0x0;
    bVar10 = false;
  }
  else {
    uVar1 = cursor[2];
    melodic_banks = *cursor << 8 | *cursor >> 8;
    percussive_banks = cursor[1] << 8 | cursor[1] >> 8;
    cursor = (ushort *)((long)cursor + 5);
    uVar5 = uVar5 - 5;
    local_80 = WOPN_Init(melodic_banks,percussive_banks);
    if (local_80 == (WOPNFile *)0x0) {
      if (local_68 != (int *)0x0) {
        *local_68 = 5;
      }
      goto LAB_00164c8e;
    }
    local_80->version = uVar8;
    local_80->lfo_freq = (byte)uVar1 & 0xf;
    if (1 < uVar8) {
      local_80->chip_type = (byte)uVar1 >> 4 & 1;
    }
    local_80->volume_model = '\0';
    bVar10 = true;
  }
  error = local_68;
  if (!bVar10) {
    return (WOPNFile *)0x0;
  }
  local_74[0] = melodic_banks;
  local_58[0] = local_80->banks_melodic;
  local_74[1] = percussive_banks;
  local_58[1] = local_80->banks_percussive;
  uVar1 = 0x41;
  if (1 < uVar8) {
    local_70 = CONCAT44(local_70._4_4_,(int)uVar7);
    lVar6 = 0;
    do {
      if ((ulong)local_74[lVar6] != 0) {
        local_60 = (ulong)local_74[lVar6] * 0x2424;
        uVar7 = 0;
        do {
          bVar10 = uVar5 < 0x22;
          uVar5 = uVar5 - 0x22;
          if (bVar10) {
            WOPN_Free(local_80);
            goto LAB_00164b33;
          }
          pWVar4 = local_58[lVar6];
          strncpy(pWVar4->bank_name + uVar7,(char *)cursor,0x20);
          pWVar4->bank_name[uVar7 + 0x20] = '\0';
          pWVar4->ins[0].inst_name[uVar7 - 3] = (char)cursor[0x10];
          pWVar4->ins[0].inst_name[uVar7 - 2] = *(char *)((long)cursor + 0x21);
          cursor = cursor + 0x11;
          uVar7 = uVar7 + 0x2424;
        } while (local_60 != uVar7);
      }
      bVar10 = lVar6 == 0;
      lVar6 = lVar6 + 1;
    } while (bVar10);
    uVar1 = 0x45;
    uVar7 = local_70 & 0xffffffff;
  }
  local_70 = (ulong)uVar1 << 7;
  lVar6 = 0;
  while (uVar3 = (ulong)local_74[lVar6], uVar3 * local_70 <= uVar5) {
    local_40 = lVar6;
    if (uVar3 != 0) {
      pWVar4 = local_58[lVar6];
      uVar9 = 0;
      local_38 = uVar3;
      do {
        lVar6 = 0x24;
        local_60 = uVar5;
        do {
          WOPN_parseInstrument
                    ((WOPNInstrument *)(pWVar4->bank_name + lVar6),(uint8_t *)cursor,(uint16_t)uVar7
                     ,'\x01');
          cursor = (ushort *)((long)cursor + (ulong)uVar1);
          lVar6 = lVar6 + 0x48;
        } while (lVar6 != 0x2424);
        uVar5 = local_60 - local_70;
        uVar9 = uVar9 + 1;
        pWVar4 = pWVar4 + 1;
      } while (uVar9 != local_38);
    }
    lVar6 = local_40 + 1;
    if (local_40 != 0) {
      return local_80;
    }
  }
  WOPN_Free(local_80);
  iVar2 = 2;
  error = local_68;
LAB_00164b8e:
  if (error != (int *)0x0) {
    *error = iVar2;
  }
  return (WOPNFile *)0x0;
}

Assistant:

WOPNFile *WOPN_LoadBankFromMem(void *mem, size_t length, int *error)
{
    WOPNFile *outFile = NULL;
    uint16_t i = 0, j = 0, k = 0;
    uint16_t version = 0;
    uint16_t count_melodic_banks     = 1;
    uint16_t count_percussive_banks   = 1;
    uint8_t *cursor = (uint8_t *)mem;

    WOPNBank *bankslots[2];
    uint16_t  bankslots_sizes[2];

#define SET_ERROR(err) \
{\
    WOPN_Free(outFile);\
    if(error)\
    {\
        *error = err;\
    }\
}

#define GO_FORWARD(bytes) { cursor += bytes; length -= bytes; }

    if(!cursor)
    {
        SET_ERROR(WOPN_ERR_NULL_POINTER);
        return NULL;
    }

    {/* Magic number */
        if(length < 11)
        {
            SET_ERROR(WOPN_ERR_UNEXPECTED_ENDING);
            return NULL;
        }
        if(memcmp(cursor, wopn2_magic1, 11) == 0)
        {
            version = 1;
        }
        else if(memcmp(cursor, wopn2_magic2, 11) != 0)
        {
            SET_ERROR(WOPN_ERR_BAD_MAGIC);
            return NULL;
        }
        GO_FORWARD(11);
    }

    if (version == 0)
    {/* Version code */
        if(length < 2)
        {
            SET_ERROR(WOPN_ERR_UNEXPECTED_ENDING);
            return NULL;
        }
        version = toUint16LE(cursor);
        if(version > wopn_latest_version)
        {
            SET_ERROR(WOPN_ERR_NEWER_VERSION);
            return NULL;
        }
        GO_FORWARD(2);
    }

    {/* Header of WOPN */
        uint8_t head[5];
        if(length < 5)
        {
            SET_ERROR(WOPN_ERR_UNEXPECTED_ENDING);
            return NULL;
        }
        memcpy(head, cursor, 5);
        count_melodic_banks = toUint16BE(head);
        count_percussive_banks = toUint16BE(head + 2);
        GO_FORWARD(5);

        outFile = WOPN_Init(count_melodic_banks, count_percussive_banks);
        if(!outFile)
        {
            SET_ERROR(WOPN_ERR_OUT_OF_MEMORY);
            return NULL;
        }

        outFile->version      = version;
        outFile->lfo_freq     = head[4] & 0xf;
        if(version >= 2)
            outFile->chip_type = (head[4] >> 4) & 1;
        outFile->volume_model = 0;
    }

    bankslots_sizes[0] = count_melodic_banks;
    bankslots[0] = outFile->banks_melodic;
    bankslots_sizes[1] = count_percussive_banks;
    bankslots[1] = outFile->banks_percussive;

    if(version >= 2) /* Bank names and LSB/MSB titles */
    {
        for(i = 0; i < 2; i++)
        {
            for(j = 0; j < bankslots_sizes[i]; j++)
            {
                if(length < 34)
                {
                    SET_ERROR(WOPN_ERR_UNEXPECTED_ENDING);
                    return NULL;
                }
                strncpy(bankslots[i][j].bank_name, (const char*)cursor, 32);
                bankslots[i][j].bank_name[32] = '\0';
                bankslots[i][j].bank_midi_lsb = cursor[32];
                bankslots[i][j].bank_midi_msb = cursor[33];
                GO_FORWARD(34);
            }
        }
    }

    {/* Read instruments data */
        uint16_t insSize = 0;
        if(version > 1)
            insSize = WOPN_INST_SIZE_V2;
        else
            insSize = WOPN_INST_SIZE_V1;
        for(i = 0; i < 2; i++)
        {
            if(length < (insSize * 128) * (size_t)bankslots_sizes[i])
            {
                SET_ERROR(WOPN_ERR_UNEXPECTED_ENDING);
                return NULL;
            }

            for(j = 0; j < bankslots_sizes[i]; j++)
            {
                for(k = 0; k < 128; k++)
                {
                    WOPNInstrument *ins = &bankslots[i][j].ins[k];
                    WOPN_parseInstrument(ins, cursor, version, 1);
                    GO_FORWARD(insSize);
                }
            }
        }
    }

#undef GO_FORWARD
#undef SET_ERROR

    return outFile;
}